

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::copy_cut_border(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  int h;
  size_t sVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  undefined1 auVar12 [16];
  ulong local_60;
  
  if (right + left == 0 && bottom + top == 0) {
    if (dst != src) {
      piVar3 = src->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = dst->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if ((*piVar3 == 0) && (dst->data != (void *)0x0)) {
          free(*(void **)((long)dst->data + -8));
        }
      }
      dst->h = 0;
      dst->c = 0;
      dst->cstep = 0;
      dst->elemsize = 0;
      dst->dims = 0;
      dst->w = 0;
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      piVar3 = src->refcount;
      dst->data = src->data;
      dst->refcount = piVar3;
      dst->elemsize = src->elemsize;
      iVar8 = src->w;
      iVar11 = src->h;
      iVar4 = src->c;
      dst->dims = src->dims;
      dst->w = iVar8;
      dst->h = iVar11;
      dst->c = iVar4;
      dst->cstep = src->cstep;
    }
  }
  else {
    iVar11 = src->w - (right + left);
    iVar8 = src->h - (bottom + top);
    if (src->dims == 3) {
      uVar1 = src->c;
      auVar12._0_4_ = -(uint)(dst->dims == 3);
      auVar12._4_4_ = -(uint)(iVar11 == dst->w);
      auVar12._8_4_ = -(uint)(iVar8 == dst->h);
      auVar12._12_4_ = -(uint)(uVar1 == dst->c);
      iVar4 = movmskps(3,auVar12);
      if ((iVar4 != 0xf) || (dst->elemsize != 4)) {
        piVar3 = dst->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if ((*piVar3 == 0) && (dst->data != (void *)0x0)) {
            free(*(void **)((long)dst->data + -8));
          }
        }
        dst->elemsize = 0;
        dst->dims = 0;
        dst->w = 0;
        dst->h = 0;
        dst->c = 0;
        dst->cstep = 0;
        dst->data = (void *)0x0;
        dst->refcount = (int *)0x0;
        dst->elemsize = 4;
        dst->dims = 3;
        dst->w = iVar11;
        dst->h = iVar8;
        dst->c = uVar1;
        uVar9 = (long)(iVar8 * iVar11) + 3U & 0x3ffffffffffffffc;
        dst->cstep = uVar9;
        lVar10 = uVar9 * (long)(int)uVar1;
        if (lVar10 != 0) {
          pvVar5 = malloc(lVar10 * 4 + 0x1c);
          pvVar6 = (void *)((long)pvVar5 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar6 - 8) = pvVar5;
          dst->data = pvVar6;
          piVar3 = (int *)((long)pvVar6 + lVar10 * 4);
          dst->refcount = piVar3;
          *piVar3 = 1;
        }
      }
      if ((dst->data != (void *)0x0) && (0 < (int)uVar1 && (long)dst->c * dst->cstep != 0)) {
        local_60 = 0;
        do {
          iVar8 = dst->h;
          if (0 < iVar8) {
            uVar2 = dst->w;
            iVar11 = src->w;
            pvVar6 = (void *)(dst->cstep * dst->elemsize * local_60 + (long)dst->data);
            pvVar5 = (void *)((long)src->data +
                             src->cstep * src->elemsize * local_60 + (long)(iVar11 * top) * 4 +
                             (long)left * 4);
            iVar4 = 0;
            do {
              if ((int)uVar2 < 0xc) {
                if (0 < (int)uVar2) {
                  uVar9 = 0;
                  do {
                    *(undefined4 *)((long)pvVar6 + uVar9 * 4) =
                         *(undefined4 *)((long)pvVar5 + uVar9 * 4);
                    uVar9 = uVar9 + 1;
                  } while (uVar2 != uVar9);
                }
              }
              else {
                memcpy(pvVar6,pvVar5,(ulong)uVar2 * 4);
              }
              pvVar6 = (void *)((long)pvVar6 + (long)(int)uVar2 * 4);
              pvVar5 = (void *)((long)pvVar5 + (long)iVar11 * 4);
              iVar4 = iVar4 + 1;
            } while (iVar4 != iVar8);
          }
          local_60 = local_60 + 1;
        } while (local_60 != uVar1);
      }
    }
    else if (src->dims == 2) {
      if ((((dst->dims != 2) || (dst->w != iVar11)) || (dst->h != iVar8)) || (dst->elemsize != 4)) {
        piVar3 = dst->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if ((*piVar3 == 0) && (dst->data != (void *)0x0)) {
            free(*(void **)((long)dst->data + -8));
          }
        }
        dst->elemsize = 0;
        dst->dims = 0;
        dst->w = 0;
        dst->h = 0;
        dst->c = 0;
        dst->cstep = 0;
        dst->data = (void *)0x0;
        dst->refcount = (int *)0x0;
        dst->elemsize = 4;
        dst->dims = 2;
        dst->w = iVar11;
        dst->h = iVar8;
        dst->c = 1;
        sVar7 = (size_t)(iVar8 * iVar11);
        dst->cstep = sVar7;
        if (iVar8 * iVar11 != 0) {
          pvVar5 = malloc(sVar7 * 4 + 0x1c);
          pvVar6 = (void *)((long)pvVar5 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar6 - 8) = pvVar5;
          dst->data = pvVar6;
          piVar3 = (int *)((long)pvVar6 + sVar7 * 4);
          dst->refcount = piVar3;
          *piVar3 = 1;
        }
      }
      if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) {
        copy_cut_border_image(src,dst,top,left);
        return;
      }
    }
  }
  return;
}

Assistant:

void copy_cut_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    int w = src.w - left - right;
    int h = src.h - top - bottom;

    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    if (src.dims == 2)
    {
        dst.create(w, h);
        if (dst.empty())
            return;

        copy_cut_border_image(src, dst, top, left);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat cutm = dst.channel(q);

            copy_cut_border_image(m, cutm, top, left);
        }
    }
}